

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int FinishRow(void *arg1,void *arg2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  VP8Decoder *dec_00;
  VP8Decoder *dec_01;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int *in_RSI;
  VP8Decoder *in_RDI;
  VP8Decoder *unaff_retaddr;
  int delta_y;
  int y_end;
  int y_start;
  int is_last_row;
  int is_first_row;
  int mb_y;
  uint8_t *vdst;
  uint8_t *udst;
  uint8_t *ydst;
  int uv_offset;
  int y_offset;
  int uvsize;
  int ysize;
  int extra_y_rows;
  int cache_id;
  VP8ThreadContext *ctx;
  int ok;
  VP8Io *io;
  VP8Decoder *dec;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_78;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = 1;
  iVar8 = (in_RDI->thread_ctx_).id_;
  uVar2 = (uint)""[in_RDI->filter_type_];
  iVar3 = uVar2 * in_RDI->cache_y_stride_;
  iVar4 = (uVar2 / 2) * in_RDI->cache_uv_stride_;
  iVar5 = iVar8 * 0x10 * in_RDI->cache_y_stride_;
  iVar6 = iVar8 * 8 * in_RDI->cache_uv_stride_;
  dec_00 = (VP8Decoder *)(in_RDI->cache_y_ + ((long)iVar5 - (long)iVar3));
  dec_01 = (VP8Decoder *)(in_RDI->cache_u_ + ((long)iVar6 - (long)iVar4));
  puVar10 = in_RDI->cache_v_ + ((long)iVar6 - (long)iVar4);
  iVar9 = (in_RDI->thread_ctx_).mb_y_;
  bVar1 = iVar9 < in_RDI->br_mb_y_ + -1;
  if (in_RDI->mt_method_ == 2) {
    ReconstructRow(unaff_retaddr,
                   (VP8ThreadContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                  );
  }
  if ((in_RDI->thread_ctx_).filter_row_ != 0) {
    FilterRow((VP8Decoder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  if (in_RDI->dither_ != 0) {
    DitherRow(dec_01);
  }
  if (*(long *)(in_RSI + 0x10) != 0) {
    local_78 = iVar9 * 0x10;
    iVar7 = (iVar9 + 1) * 0x10;
    if (iVar9 == 0) {
      *(uint8_t **)(in_RSI + 6) = in_RDI->cache_y_ + iVar5;
      *(uint8_t **)(in_RSI + 8) = in_RDI->cache_u_ + iVar6;
      *(uint8_t **)(in_RSI + 10) = in_RDI->cache_v_ + iVar6;
    }
    else {
      local_78 = local_78 - uVar2;
      *(VP8Decoder **)(in_RSI + 6) = dec_00;
      *(VP8Decoder **)(in_RSI + 8) = dec_01;
      *(uint8_t **)(in_RSI + 10) = puVar10;
    }
    if (bVar1) {
      iVar7 = iVar7 - uVar2;
    }
    if (in_RSI[0x21] < iVar7) {
      iVar7 = in_RSI[0x21];
    }
    in_RSI[0x26] = 0;
    in_RSI[0x27] = 0;
    if ((in_RDI->alpha_data_ != (uint8_t *)0x0) && (local_78 < iVar7)) {
      puVar11 = VP8DecompressAlphaRows
                          (dec_00,(VP8Io *)dec_01,(int)((ulong)puVar10 >> 0x20),(int)puVar10);
      *(uint8_t **)(in_RSI + 0x26) = puVar11;
      if (*(long *)(in_RSI + 0x26) == 0) {
        iVar8 = VP8SetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR,"Could not decode alpha data.");
        return iVar8;
      }
    }
    if (local_78 < in_RSI[0x20]) {
      iVar9 = in_RSI[0x20] - local_78;
      local_78 = in_RSI[0x20];
      *(long *)(in_RSI + 6) = *(long *)(in_RSI + 6) + (long)(in_RDI->cache_y_stride_ * iVar9);
      *(long *)(in_RSI + 8) =
           *(long *)(in_RSI + 8) + (long)(in_RDI->cache_uv_stride_ * (iVar9 >> 1));
      *(long *)(in_RSI + 10) =
           *(long *)(in_RSI + 10) + (long)(in_RDI->cache_uv_stride_ * (iVar9 >> 1));
      if (*(long *)(in_RSI + 0x26) != 0) {
        *(long *)(in_RSI + 0x26) = *(long *)(in_RSI + 0x26) + (long)(*in_RSI * iVar9);
      }
    }
    if (local_78 < iVar7) {
      *(long *)(in_RSI + 6) = *(long *)(in_RSI + 6) + (long)in_RSI[0x1e];
      *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + (long)(in_RSI[0x1e] >> 1);
      *(long *)(in_RSI + 10) = *(long *)(in_RSI + 10) + (long)(in_RSI[0x1e] >> 1);
      if (*(long *)(in_RSI + 0x26) != 0) {
        *(long *)(in_RSI + 0x26) = *(long *)(in_RSI + 0x26) + (long)in_RSI[0x1e];
      }
      in_RSI[2] = local_78 - in_RSI[0x20];
      in_RSI[3] = in_RSI[0x1f] - in_RSI[0x1e];
      in_RSI[4] = iVar7 - local_78;
      local_2c = (**(code **)(in_RSI + 0x10))(in_RSI);
    }
  }
  if ((iVar8 + 1 == in_RDI->num_caches_) && (bVar1)) {
    memcpy(in_RDI->cache_y_ + -(long)iVar3,
           (void *)((long)(dec_00->filter_hdr_).ref_lf_delta_ +
                   (long)(in_RDI->cache_y_stride_ << 4) + -100),(long)iVar3);
    memcpy(in_RDI->cache_u_ + -(long)iVar4,
           (void *)((long)(dec_01->filter_hdr_).ref_lf_delta_ +
                   (long)(in_RDI->cache_uv_stride_ << 3) + -100),(long)iVar4);
    memcpy(in_RDI->cache_v_ + -(long)iVar4,puVar10 + (in_RDI->cache_uv_stride_ << 3),(long)iVar4);
  }
  return local_2c;
}

Assistant:

static int FinishRow(void* arg1, void* arg2) {
  VP8Decoder* const dec = (VP8Decoder*)arg1;
  VP8Io* const io = (VP8Io*)arg2;
  int ok = 1;
  const VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int cache_id = ctx->id_;
  const int extra_y_rows = kFilterExtraRows[dec->filter_type_];
  const int ysize = extra_y_rows * dec->cache_y_stride_;
  const int uvsize = (extra_y_rows / 2) * dec->cache_uv_stride_;
  const int y_offset = cache_id * 16 * dec->cache_y_stride_;
  const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
  uint8_t* const ydst = dec->cache_y_ - ysize + y_offset;
  uint8_t* const udst = dec->cache_u_ - uvsize + uv_offset;
  uint8_t* const vdst = dec->cache_v_ - uvsize + uv_offset;
  const int mb_y = ctx->mb_y_;
  const int is_first_row = (mb_y == 0);
  const int is_last_row = (mb_y >= dec->br_mb_y_ - 1);

  if (dec->mt_method_ == 2) {
    ReconstructRow(dec, ctx);
  }

  if (ctx->filter_row_) {
    FilterRow(dec);
  }

  if (dec->dither_) {
    DitherRow(dec);
  }

  if (io->put != NULL) {
    int y_start = MACROBLOCK_VPOS(mb_y);
    int y_end = MACROBLOCK_VPOS(mb_y + 1);
    if (!is_first_row) {
      y_start -= extra_y_rows;
      io->y = ydst;
      io->u = udst;
      io->v = vdst;
    } else {
      io->y = dec->cache_y_ + y_offset;
      io->u = dec->cache_u_ + uv_offset;
      io->v = dec->cache_v_ + uv_offset;
    }

    if (!is_last_row) {
      y_end -= extra_y_rows;
    }
    if (y_end > io->crop_bottom) {
      y_end = io->crop_bottom;    // make sure we don't overflow on last row.
    }
    // If dec->alpha_data_ is not NULL, we have some alpha plane present.
    io->a = NULL;
    if (dec->alpha_data_ != NULL && y_start < y_end) {
      io->a = VP8DecompressAlphaRows(dec, io, y_start, y_end - y_start);
      if (io->a == NULL) {
        return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                           "Could not decode alpha data.");
      }
    }
    if (y_start < io->crop_top) {
      const int delta_y = io->crop_top - y_start;
      y_start = io->crop_top;
      assert(!(delta_y & 1));
      io->y += dec->cache_y_stride_ * delta_y;
      io->u += dec->cache_uv_stride_ * (delta_y >> 1);
      io->v += dec->cache_uv_stride_ * (delta_y >> 1);
      if (io->a != NULL) {
        io->a += io->width * delta_y;
      }
    }
    if (y_start < y_end) {
      io->y += io->crop_left;
      io->u += io->crop_left >> 1;
      io->v += io->crop_left >> 1;
      if (io->a != NULL) {
        io->a += io->crop_left;
      }
      io->mb_y = y_start - io->crop_top;
      io->mb_w = io->crop_right - io->crop_left;
      io->mb_h = y_end - y_start;
      ok = io->put(io);
    }
  }
  // rotate top samples if needed
  if (cache_id + 1 == dec->num_caches_) {
    if (!is_last_row) {
      memcpy(dec->cache_y_ - ysize, ydst + 16 * dec->cache_y_stride_, ysize);
      memcpy(dec->cache_u_ - uvsize, udst + 8 * dec->cache_uv_stride_, uvsize);
      memcpy(dec->cache_v_ - uvsize, vdst + 8 * dec->cache_uv_stride_, uvsize);
    }
  }

  return ok;
}